

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_lock.cpp
# Opt level: O0

void mpp_spinlock_lock(spinlock_t *lock)

{
  RK_S64 RVar1;
  bool bVar2;
  long local_18;
  RK_S64 time;
  spinlock_t *lock_local;
  
  local_18 = 0;
  if (lock->debug != 0) {
    local_18 = mpp_time();
  }
  do {
    LOCK();
    bVar2 = lock->lock == 0;
    if (bVar2) {
      lock->lock = 1;
    }
    UNLOCK();
  } while (!bVar2);
  if ((lock->debug != 0) && (local_18 != 0)) {
    RVar1 = mpp_time();
    lock->time = (RVar1 - local_18) + lock->time;
    lock->count = lock->count + 1;
  }
  return;
}

Assistant:

void mpp_spinlock_lock(spinlock_t *lock)
{
    RK_S64 time = 0;

    if (lock->debug)
        time = mpp_time();

    while (!MPP_BOOL_CAS(&lock->lock, LOCK_IDLE, LOCK_BUSY)) {
        asm("NOP");
        asm("NOP");
    }

    if (lock->debug && time) {
        lock->time += mpp_time() - time;
        lock->count++;
    }
}